

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_init(opj_tcd_t *p_tcd,opj_image_t *p_image,opj_cp_t *p_cp)

{
  opj_tcd_tile_t *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  OPJ_BOOL OVar3;
  
  p_tcd->image = p_image;
  p_tcd->cp = p_cp;
  poVar1 = (opj_tcd_tile_t *)opj_calloc(1,0x358);
  p_tcd->tcd_image->tiles = poVar1;
  OVar3 = 0;
  if (poVar1 != (opj_tcd_tile_t *)0x0) {
    poVar2 = (opj_tcd_tilecomp_t *)opj_calloc((ulong)p_image->numcomps,0x40);
    poVar1 = p_tcd->tcd_image->tiles;
    poVar1->comps = poVar2;
    if (poVar2 != (opj_tcd_tilecomp_t *)0x0) {
      poVar1->numcomps = p_image->numcomps;
      p_tcd->tp_pos = (p_cp->m_specific_param).m_dec.m_layer;
      OVar3 = 1;
    }
  }
  return OVar3;
}

Assistant:

OPJ_BOOL opj_tcd_init( opj_tcd_t *p_tcd,
                                           opj_image_t * p_image,
                                           opj_cp_t * p_cp )
{
        p_tcd->image = p_image;
        p_tcd->cp = p_cp;

        p_tcd->tcd_image->tiles = (opj_tcd_tile_t *) opj_calloc(1,sizeof(opj_tcd_tile_t));
        if (! p_tcd->tcd_image->tiles) {
                return OPJ_FALSE;
        }

        p_tcd->tcd_image->tiles->comps = (opj_tcd_tilecomp_t *) opj_calloc(p_image->numcomps,sizeof(opj_tcd_tilecomp_t));
        if (! p_tcd->tcd_image->tiles->comps ) {
                return OPJ_FALSE;
        }

        p_tcd->tcd_image->tiles->numcomps = p_image->numcomps;
        p_tcd->tp_pos = p_cp->m_specific_param.m_enc.m_tp_pos;

        return OPJ_TRUE;
}